

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11JsonConfig.cpp
# Opt level: O3

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
helics::HelicsConfigJSON::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          HelicsConfigJSON *this,istream *input)

{
  value_t vVar1;
  json_value jVar2;
  json config;
  string errs;
  data local_f8;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  string local_c8;
  _Any_data local_a8;
  code *local_98;
  undefined8 uStack_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  data local_50;
  data local_40;
  
  local_e0 = 0;
  local_d8 = 0;
  local_e8 = &local_d8;
  if (this->mSkipJson == false) {
    local_f8.m_type = null;
    local_f8.m_value.object = (object_t *)0x0;
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    local_98 = (code *)0x0;
    uStack_90 = 0;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<std::istream&>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)&local_40,input,(parser_callback_t *)&local_a8,true,true);
    jVar2 = local_f8.m_value;
    vVar1 = local_f8.m_type;
    local_f8.m_type = local_40.m_type;
    local_40.m_type = vVar1;
    local_f8.m_value = local_40.m_value;
    local_40.m_value.string = jVar2.string;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_40);
    if (local_98 != (code *)0x0) {
      (*local_98)((_Any_data *)&local_a8,(_Any_data *)&local_a8,__destroy_functor);
    }
    getSection((helics *)&local_50,(json *)&local_f8,&(this->super_ConfigBase).configSection,
               (this->super_ConfigBase).configIndex);
    jVar2 = local_f8.m_value;
    vVar1 = local_f8.m_type;
    local_f8.m_type = local_50.m_type;
    local_50.m_type = vVar1;
    local_f8.m_value = local_50.m_value;
    local_50.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_50);
    if (local_f8.m_type == null) {
      if (this->mFallbackToDefault == true) {
        CLI::ConfigBase::from_config(__return_storage_ptr__,&this->super_ConfigBase,input);
      }
      else {
        (__return_storage_ptr__->
        super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
    }
    else {
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      fromConfigInternal(__return_storage_ptr__,this,(json *)&local_f8,&local_c8,&local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]) + 1);
      }
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_f8);
  }
  else {
    CLI::ConfigBase::from_config(__return_storage_ptr__,&this->super_ConfigBase,input);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CLI::ConfigItem> HelicsConfigJSON::from_config(std::istream& input) const
{
    std::string errs;
    if (!mSkipJson) {
        nlohmann::json config;
        try {
            config = nlohmann::json::parse(input, nullptr, true, true);
            config = getSection(config, section(), configIndex);
            if (config.is_null()) {
                if (mFallbackToDefault) {
                    return ConfigBase::from_config(input);
                }
                return {};
            }
            return fromConfigInternal(config);
        }
        catch (const nlohmann::json::parse_error& err) {
            errs = err.what();
        }
        if (mThrowJsonErrors && !errs.empty()) {
            throw(CLI::FileError(errs));
        }
    }
    return ConfigBase::from_config(input);
}